

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  WildcardPattern *this_local;
  
  this->_vptr_WildcardPattern = (_func_int **)&PTR__WildcardPattern_00268718;
  std::__cxx11::string::~string((string *)&this->m_pattern);
  return;
}

Assistant:

WildcardPattern::~WildcardPattern() {}